

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O0

void __thiscall rlib::JsonT<void>::Stringify::Format::Format(Format *this)

{
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  allocator<char> *in_stack_fffffffffffffff0;
  string *__s;
  
  __s = in_RDI;
  std::__cxx11::string::string(in_RDI);
  std::__cxx11::string::string(in_RDI + 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (unaff_retaddr,(char *)__s,in_stack_fffffffffffffff0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffff7);
  return;
}

Assistant:

Format() {}